

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.c
# Opt level: O0

char * curl_share_strerror(CURLSHcode error)

{
  char *pcStack_10;
  CURLSHcode error_local;
  
  switch(error) {
  case CURLSHE_OK:
    pcStack_10 = "No error";
    break;
  case CURLSHE_BAD_OPTION:
    pcStack_10 = "Unknown share option";
    break;
  case CURLSHE_IN_USE:
    pcStack_10 = "Share currently in use";
    break;
  case CURLSHE_INVALID:
    pcStack_10 = "Invalid share handle";
    break;
  case CURLSHE_NOMEM:
    pcStack_10 = "Out of memory";
    break;
  case CURLSHE_NOT_BUILT_IN:
    pcStack_10 = "Feature not enabled in this library";
    break;
  case CURLSHE_LAST:
  default:
    pcStack_10 = "CURLSHcode unknown";
  }
  return pcStack_10;
}

Assistant:

const char *
curl_share_strerror(CURLSHcode error)
{
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  switch(error) {
  case CURLSHE_OK:
    return "No error";

  case CURLSHE_BAD_OPTION:
    return "Unknown share option";

  case CURLSHE_IN_USE:
    return "Share currently in use";

  case CURLSHE_INVALID:
    return "Invalid share handle";

  case CURLSHE_NOMEM:
    return "Out of memory";

  case CURLSHE_NOT_BUILT_IN:
    return "Feature not enabled in this library";

  case CURLSHE_LAST:
    break;
  }

  return "CURLSHcode unknown";
#else
  if(error == CURLSHE_OK)
    return "No error";
  else
    return "Error";
#endif
}